

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# succinctFMIndex.h
# Opt level: O0

void __thiscall bwtil::succinctFMIndex::loadFromFile(succinctFMIndex *this,FILE *fp)

{
  FILE *in_RSI;
  long in_RDI;
  ulint numBytes;
  FILE *in_stack_00000188;
  IndexedBWT *in_stack_00000190;
  
  fread((void *)(in_RDI + 0x138),8,1,in_RSI);
  fread((void *)(in_RDI + 0x140),4,1,in_RSI);
  fread((void *)(in_RDI + 0x144),4,1,in_RSI);
  fread((void *)(in_RDI + 0x148),8,1,in_RSI);
  IndexedBWT::loadFromFile(in_stack_00000190,in_stack_00000188);
  return;
}

Assistant:

void loadFromFile(FILE *fp){

		ulint numBytes;

		numBytes = fread(&n, sizeof(ulint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&log_sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&offrate, sizeof(ulint), 1, fp);
		assert(numBytes>0);

		idxBWT.loadFromFile(fp);

		numBytes++;//avoids "variable not used" warning

	}